

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMarker.cpp
# Opt level: O1

void __thiscall chrono::ChMarker::Impose_Rel_Coord(ChMarker *this,Coordsys *m_coord)

{
  double dVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  Quaternion qtemp;
  ChQuaternion<double> local_68;
  ChQuaternion<double> local_48;
  
  local_48.m_data[0] = 0.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 0.0;
  ChFrame<double>::SetCoord(&(this->super_ChFrameMoving<double>).super_ChFrame<double>,m_coord);
  dVar1 = (m_coord->pos).m_data[0];
  dVar3 = (this->super_ChObj).ChTime;
  (*((this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[0] = dVar1 - dVar3;
  dVar1 = (m_coord->pos).m_data[1];
  dVar3 = (this->super_ChObj).ChTime;
  (*((this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[1] = dVar1 - dVar3;
  dVar1 = (m_coord->pos).m_data[2];
  dVar3 = (this->super_ChObj).ChTime;
  (*((this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  (this->rest_coord).pos.m_data[2] = dVar1 - dVar3;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (this->super_ChObj).ChTime;
  (*((this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_ChFunction[4])();
  auVar2._8_8_ = 0x8000000000000000;
  auVar2._0_8_ = 0x8000000000000000;
  auVar2 = vxorpd_avx512vl(auVar4,auVar2);
  Q_from_AngAxis(&local_68,auVar2._0_8_,&this->motion_axis);
  local_48.m_data[0] = local_68.m_data[0];
  local_48.m_data[1] = local_68.m_data[1];
  local_48.m_data[2] = local_68.m_data[2];
  local_48.m_data[3] = local_68.m_data[3];
  Qcross(&m_coord->rot,&local_48);
  if (&local_68 != &(this->rest_coord).rot) {
    (this->rest_coord).rot.m_data[0] = local_68.m_data[0];
    (this->rest_coord).rot.m_data[1] = local_68.m_data[1];
    (this->rest_coord).rot.m_data[2] = local_68.m_data[2];
    (this->rest_coord).rot.m_data[3] = local_68.m_data[3];
  }
  if (this->Body != (ChBody *)0x0) {
    ChFrameMoving<double>::TransformLocalToParent
              (&(this->Body->super_ChBodyFrame).super_ChFrameMoving<double>,
               &this->super_ChFrameMoving<double>,&this->abs_frame);
  }
  return;
}

Assistant:

void ChMarker::Impose_Rel_Coord(const Coordsys& m_coord) {
    Quaternion qtemp;
    // set the actual coordinates
    SetCoord(m_coord);
    // set the resting position coordinates
    rest_coord.pos.x() = m_coord.pos.x() - motion_X->Get_y(ChTime);
    rest_coord.pos.y() = m_coord.pos.y() - motion_Y->Get_y(ChTime);
    rest_coord.pos.z() = m_coord.pos.z() - motion_Z->Get_y(ChTime);
    qtemp = Q_from_AngAxis(-(motion_ang->Get_y(ChTime)), motion_axis);
    rest_coord.rot = Qcross(m_coord.rot, qtemp);  // ***%%% check
                                                  // set also the absolute positions, and other.
    UpdateState();
}